

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::JsonTranslatorOperator::convertToMessage(JsonTranslatorOperator *this,SmallBuffer *value)

{
  SmallBuffer *this_00;
  defV *in_RSI;
  _Head_base<0UL,_helics::Message_*,_false> in_RDI;
  string_view sVar1;
  data_view *unaff_retaddr;
  SmallBuffer sb;
  defV val;
  __single_object *m;
  data_view *this_01;
  SmallBuffer *this_02;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  DataType in_stack_ffffffffffffff2c;
  data_view local_68;
  Message *pMVar2;
  DataType baseType;
  
  this_02 = (SmallBuffer *)&stack0xffffffffffffffb8;
  pMVar2 = in_RDI._M_head_impl;
  CLI::std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)0x31d2ce);
  baseType = (DataType)((ulong)pMVar2 >> 0x20);
  this_01 = &local_68;
  data_view::data_view(this_01,(SmallBuffer *)in_RDI._M_head_impl);
  helics::valueExtract(unaff_retaddr,baseType,in_RSI);
  data_view::~data_view((data_view *)0x31d30b);
  typeConvertDefV(in_stack_ffffffffffffff2c,
                  (defV *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::make_unique<helics::Message>();
  sVar1 = SmallBuffer::to_string((SmallBuffer *)0x31d33f);
  this_00 = (SmallBuffer *)sVar1._M_str;
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x31d369);
  SmallBuffer::operator=(this_02,(basic_string_view<char,_std::char_traits<char>_> *)this_01);
  SmallBuffer::~SmallBuffer(this_00);
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)0x31d41d);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Message> JsonTranslatorOperator::convertToMessage(const SmallBuffer& value)
{
    defV val;
    valueExtract(value, DataType::HELICS_ANY, val);
    auto sb = typeConvertDefV(DataType::HELICS_JSON, val);
    auto m = std::make_unique<Message>();
    m->data = sb.to_string();
    return m;
}